

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

size_t strcspn(char *__s,char *__reject)

{
  char *pcVar1;
  size_t local_28;
  size_t res;
  char *s2_local;
  char *s1_local;
  
  local_28 = 0;
  s2_local = __s;
  while ((*s2_local != '\0' && (pcVar1 = strchr(__reject,(int)*s2_local), pcVar1 == (char *)0x0))) {
    s2_local = s2_local + 1;
    local_28 = local_28 + 1;
  }
  return local_28;
}

Assistant:

size_t strcspn(const char *s1, const char *s2) {
    size_t res = 0;
    while (*s1 != '\0') {
        if (strchr(s2, *s1) == NULL) {
            ++s1;
            ++res;
        } else {
            return res;
        }
    }
    return res;
}